

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

void mpc_input_rewind(mpc_input_t *i)

{
  mpc_state_t *pmVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  
  if (0 < i->backtrack) {
    lVar6 = (long)i->marks_num;
    pmVar1 = i->marks + lVar6 + -1;
    lVar3 = pmVar1->row;
    plVar2 = &i->marks[lVar6 + -1].col;
    lVar4 = *plVar2;
    uVar5 = plVar2[1];
    (i->state).pos = pmVar1->pos;
    (i->state).row = lVar3;
    (i->state).col = lVar4;
    *(undefined8 *)&(i->state).term = uVar5;
    i->last = i->lasts[lVar6 + -1];
    if (i->type == 1) {
      fseek((FILE *)i->file,(i->state).pos,0);
    }
    mpc_input_unmark(i);
    return;
  }
  return;
}

Assistant:

static void mpc_input_rewind(mpc_input_t *i) {

  if (i->backtrack < 1) { return; }

  i->state = i->marks[i->marks_num-1];
  i->last  = i->lasts[i->marks_num-1];

  if (i->type == MPC_INPUT_FILE) {
    fseek(i->file, i->state.pos, SEEK_SET);
  }

  mpc_input_unmark(i);
}